

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

_Bool run_container_iterate64
                (run_container_t *cont,uint32_t base,roaring_iterator64 iterator,uint64_t high_bits,
                void *ptr)

{
  _Bool _Var1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  if (0 < cont->n_runs) {
    lVar3 = 0;
    do {
      lVar4 = (ulong)cont->runs[lVar3].length + 1;
      uVar2 = cont->runs[lVar3].value + base;
      do {
        _Var1 = (*iterator)(uVar2 | high_bits,ptr);
        if (!_Var1) {
          return false;
        }
        uVar2 = uVar2 + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      lVar3 = lVar3 + 1;
    } while (lVar3 < cont->n_runs);
  }
  return true;
}

Assistant:

bool run_container_iterate64(const run_container_t *cont, uint32_t base,
                             roaring_iterator64 iterator, uint64_t high_bits,
                             void *ptr) {
    for (int i = 0; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;

        for (int j = 0; j <= le; ++j)
            if (!iterator(high_bits | (uint64_t)(run_start + j), ptr))
                return false;
    }
    return true;
}